

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationSpeed::IntToDescriptor
          (ChLinkMotorRotationSpeed *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L
          ,ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  double dVar1;
  ulong uVar2;
  double *local_40;
  long local_38;
  
  uVar2 = (ulong)off_v;
  ChLinkMateGeneric::IntToDescriptor((ChLinkMateGeneric *)this,off_v,v,R,off_L,L,Qc);
  if ((long)uVar2 <
      (v->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    dVar1 = (v->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar2];
    ChVariables::Get_qb((ChVectorRef *)&local_40,&(this->variable).super_ChVariables);
    if (0 < local_38) {
      *local_40 = dVar1;
      if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar2) goto LAB_005b6b92;
      dVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [uVar2];
      ChVariables::Get_fb((ChVectorRef *)&local_40,&(this->variable).super_ChVariables);
      if (0 < local_38) {
        *local_40 = dVar1;
        return;
      }
    }
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                 );
  }
LAB_005b6b92:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkMotorRotationSpeed::IntToDescriptor(const unsigned int off_v,  // offset in v, R
                                               const ChStateDelta& v,
                                               const ChVectorDynamic<>& R,
                                               const unsigned int off_L,  // offset in L, Qc
                                               const ChVectorDynamic<>& L,
                                               const ChVectorDynamic<>& Qc) {
    // inherit parent
    ChLinkMotorRotation::IntToDescriptor(off_v, v, R, off_L, L, Qc);

    this->variable.Get_qb()(0, 0) = v(off_v);
    this->variable.Get_fb()(0, 0) = R(off_v);
}